

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall higan::TcpConnection::~TcpConnection(TcpConnection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Atomic_word *p_Var2;
  _Manager_type p_Var3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  LogLevel LVar6;
  int iVar7;
  Logger local_330;
  Fmt local_118;
  
  Channel::DisableAll(&this->channel_);
  if (this->connecting_ == true) {
    LVar6 = Logger::GetLogLevel();
    if ((int)LVar6 < 3) {
      Logger::Logger(&local_330,WARN,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/TcpConnection.cpp"
                     ,0x1f,"~TcpConnection");
      Fmt::Fmt(&local_118,"connection: %s closed by destructor",
               (this->connection_name_)._M_dataplus._M_p);
      Logger::operator<<(&local_330,&local_118);
      Logger::~Logger(&local_330);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree(&(this->context_map_)._M_t);
  p_Var3 = (this->write_over_callback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->write_over_callback_,(_Any_data *)&this->write_over_callback_,
              __destroy_functor);
  }
  p_Var3 = (this->new_connection_callback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->new_connection_callback_,
              (_Any_data *)&this->new_connection_callback_,__destroy_functor);
  }
  p_Var3 = (this->error_callback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->error_callback_,(_Any_data *)&this->error_callback_,
              __destroy_functor);
  }
  p_Var3 = (this->message_callback_).super__Function_base._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    (*p_Var3)((_Any_data *)&this->message_callback_,(_Any_data *)&this->message_callback_,
              __destroy_functor);
  }
  Buffer::~Buffer(&this->output_buffer_);
  Buffer::~Buffer(&this->input_buffer_);
  Channel::~Channel(&this->channel_);
  Socket::~Socket(&this->socket_);
  pcVar4 = (this->connection_name_)._M_dataplus._M_p;
  paVar1 = &(this->connection_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  p_Var5 = (this->super_enable_shared_from_this<higan::TcpConnection>)._M_weak_this.
           super___weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2 = &p_Var5->_M_weak_count;
      iVar7 = *p_Var2;
      *p_Var2 = *p_Var2 + -1;
      UNLOCK();
    }
    else {
      iVar7 = p_Var5->_M_weak_count;
      p_Var5->_M_weak_count = iVar7 + -1;
    }
    if (iVar7 == 1) {
      (*p_Var5->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

TcpConnection::~TcpConnection()
{
	channel_.DisableAll();

	if (connecting_)
	{
		LOG_WARN << higan::Fmt("connection: %s closed by destructor", connection_name_.c_str());
	}
}